

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix * __thiscall maths::Matrix::operator*=(Matrix *this,Matrix *m)

{
  long lVar1;
  Matrix *pMVar2;
  long in_RSI;
  long in_RDI;
  int k;
  int j;
  int i;
  Matrix temp;
  Matrix *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int iVar3;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  
  Matrix(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  for (iVar3 = 0; iVar3 < local_20; iVar3 = iVar3 + 1) {
    for (in_stack_ffffffffffffffd8 = 0; in_stack_ffffffffffffffd8 < local_1c;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < *(int *)(in_RDI + 4);
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        lVar1 = *(long *)(local_18 + (long)iVar3 * 8);
        *(double *)(lVar1 + (long)in_stack_ffffffffffffffd8 * 8) =
             *(double *)
              (*(long *)(*(long *)(in_RDI + 8) + (long)iVar3 * 8) +
              (long)in_stack_ffffffffffffffd4 * 8) *
             *(double *)
              (*(long *)(*(long *)(in_RSI + 8) + (long)in_stack_ffffffffffffffd4 * 8) +
              (long)in_stack_ffffffffffffffd8 * 8) +
             *(double *)(lVar1 + (long)in_stack_ffffffffffffffd8 * 8);
      }
    }
  }
  pMVar2 = operator=((Matrix *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                     (Matrix *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  ~Matrix(in_stack_ffffffffffffffc0);
  return pMVar2;
}

Assistant:

Matrix& Matrix::operator*=(const Matrix& m)
{
    Matrix temp(rows_, m.cols_);
    for (int i = 0; i < temp.rows_; ++i) {
        for (int j = 0; j < temp.cols_; ++j) {
            for (int k = 0; k < cols_; ++k) {
                temp.p[i][j] += (p[i][k] * m.p[k][j]);
            }
        }
    }
    return (*this = temp);
}